

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

LabelId __thiscall
front::irGenerator::irGenerator::LeftValueToLabelId(irGenerator *this,LeftVal *leftVal)

{
  irGenerator *this_00;
  int *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  int in_EDX;
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  string *in_RDI;
  LabelId id;
  string local_38 [36];
  LabelId local_14;
  
  this_00 = (irGenerator *)
            std::
            variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::index(in_RSI,(char *)in_RSI,in_EDX);
  if (this_00 == (irGenerator *)0x0) {
    piVar1 = std::get<int,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x25ce05);
    local_14 = *piVar1;
  }
  else if (this_00 == (irGenerator *)0x1) {
    pbVar2 = std::get<std::__cxx11::string,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x25ce17);
    std::__cxx11::string::string(local_38,(string *)pbVar2);
    local_14 = nameToLabelId(this_00,in_RDI);
    std::__cxx11::string::~string(local_38);
  }
  return local_14;
}

Assistant:

LabelId irGenerator::LeftValueToLabelId(LeftVal leftVal) {
  LabelId id;
  switch (leftVal.index()) {
    case 0:
      id = get<LabelId>(leftVal);
      break;
    case 1:
      id = nameToLabelId(get<string>(leftVal));
      break;
  }
  return id;
}